

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxiliaryMemorySwitches.hpp
# Opt level: O2

bool __thiscall
Apple::II::
AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false>_>
::MainState::operator!=(MainState *this,MainState *rhs)

{
  bool bVar1;
  
  bVar1 = true;
  if (((((this->base).read == (rhs->base).read) && ((this->base).write == (rhs->base).write)) &&
      ((this->region_04_08).read == (rhs->region_04_08).read)) &&
     (((this->region_04_08).write == (rhs->region_04_08).write &&
      ((this->region_20_40).read == (rhs->region_20_40).read)))) {
    bVar1 = (this->region_20_40).write != (rhs->region_20_40).write;
  }
  return bVar1;
}

Assistant:

bool operator != (const MainState &rhs) const {
				return
					base.read != rhs.base.read || base.write != rhs.base.write ||
					region_04_08.read != rhs.region_04_08.read || region_04_08.write != rhs.region_04_08.write ||
					region_20_40.read != rhs.region_20_40.read || region_20_40.write != rhs.region_20_40.write;
			}